

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_landscape_on_grid.h
# Opt level: O3

double __thiscall
Gudhi::Persistence_representations::Persistence_landscape_on_grid::compute_integral_of_landscape
          (Persistence_landscape_on_grid *this)

{
  pointer pvVar1;
  pointer *ppdVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t level;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  pvVar1 = (this->values_of_landscapes).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar7 = 0.0;
  lVar3 = (long)(this->values_of_landscapes).
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    ppdVar2 = (pointer *)
              ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data + 8);
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      uVar6 = (long)*ppdVar2 - (long)((_Vector_impl_data *)(ppdVar2 + -1))->_M_start >> 3;
      uVar5 = uVar4;
      if (uVar4 < uVar6) {
        uVar5 = uVar6;
      }
      ppdVar2 = ppdVar2 + 3;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if (uVar5 != 0) {
      if (uVar6 < uVar4) {
        uVar6 = uVar4;
      }
      dVar7 = 0.0;
      level = 0;
      do {
        dVar8 = compute_integral_of_landscape(this,level);
        dVar7 = dVar7 + dVar8;
        level = level + 1;
      } while (uVar6 != level);
    }
  }
  return dVar7;
}

Assistant:

double compute_integral_of_landscape() const {
    size_t maximal_level = this->number_of_nonzero_levels();
    double result = 0;
    for (size_t i = 0; i != maximal_level; ++i) {
      result += this->compute_integral_of_landscape(i);
    }
    return result;
  }